

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::PoolingLayerParams::MergePartialFromCodedStream
          (PoolingLayerParams *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  uint8 *puVar4;
  bool bVar5;
  short extraout_AX;
  uint uVar6;
  uint extraout_EAX;
  uint32 uVar7;
  SamePadding *pSVar8;
  PoolingLayerParams_ValidCompletePadding *pPVar9;
  ValidPadding *pVVar10;
  pair<int,_int> pVar11;
  RepeatedField<unsigned_long> *pRVar12;
  int iVar13;
  int iVar14;
  char cVar15;
  uint uVar16;
  ulong uVar17;
  
  do {
    pbVar3 = input->buffer_;
    uVar7 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      pbVar1 = pbVar3 + 1;
      uVar16 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        uVar7 = (uint)bVar2;
        if ((input->buffer_end_ <= pbVar1) ||
           (uVar7 = (uint)bVar2, (~(uint)*pbVar1 & uVar16) < 0x80)) goto LAB_00497c23;
        uVar16 = ((uint)bVar2 + (uint)*pbVar1 * 0x80) - 0x80;
        input->buffer_ = pbVar3 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar17 = (ulong)uVar16 | 0x100000000;
    }
    else {
LAB_00497c23:
      uVar7 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar7);
      uVar17 = 0;
      if (uVar7 - 1 < 0x3fff) {
        uVar17 = 0x100000000;
      }
      uVar17 = uVar7 | uVar17;
    }
    uVar16 = (uint)uVar17;
    if ((uVar17 & 0x100000000) == 0) goto LAB_00497831;
    uVar6 = (uint)(uVar17 >> 3) & 0x1fffffff;
    cVar15 = (char)uVar17;
    if (uVar6 < 0x1e) {
      if (uVar6 == 1) {
        if (cVar15 != '\b') goto LAB_00497831;
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar2 = *pbVar3;
          uVar17 = (ulong)bVar2;
          uVar7 = (uint32)bVar2;
          if ((char)bVar2 < '\0') goto LAB_00497c4a;
          input->buffer_ = pbVar3 + 1;
          bVar5 = true;
        }
        else {
          uVar7 = 0;
LAB_00497c4a:
          uVar17 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar7);
          bVar5 = -1 < (long)uVar17;
        }
        if (!bVar5) {
          iVar14 = 6;
          goto LAB_00497863;
        }
        this->type_ = (int)uVar17;
      }
      else {
        if (uVar6 != 10) {
          if (uVar6 == 0x14) {
            if (cVar15 == -0x60) {
              iVar14 = 2;
              uVar7 = 0xa2;
              pRVar12 = &this->stride_;
              goto LAB_00497abd;
            }
            pRVar12 = &this->stride_;
            if ((uVar16 & 0xff) == 0xa2) goto LAB_004979eb;
          }
          goto LAB_00497831;
        }
        if (cVar15 == 'P') {
          iVar14 = 1;
          uVar7 = 0x52;
          pRVar12 = &this->kernelsize_;
LAB_00497abd:
          bVar5 = google::protobuf::internal::WireFormatLite::
                  ReadRepeatedPrimitive<unsigned_long,(google::protobuf::internal::WireFormatLite::FieldType)4>
                            (iVar14,uVar7,input,pRVar12);
        }
        else {
          pRVar12 = &this->kernelsize_;
          if ((uVar16 & 0xff) != 0x52) goto LAB_00497831;
LAB_004979eb:
          bVar5 = google::protobuf::internal::WireFormatLite::
                  ReadPackedPrimitive<unsigned_long,(google::protobuf::internal::WireFormatLite::FieldType)4>
                            (input,pRVar12);
        }
LAB_00497858:
        if (bVar5 == false) goto LAB_00497be9;
      }
LAB_00497860:
      iVar14 = 0;
    }
    else if (uVar6 < 0x20) {
      if (uVar6 == 0x1e) {
        if (cVar15 == -0xe) {
          if (this->_oneof_case_[0] != 0x1e) {
            clear_PoolingPaddingType(this);
            this->_oneof_case_[0] = 0x1e;
            pVVar10 = (ValidPadding *)operator_new(0x20);
            ValidPadding::ValidPadding(pVVar10);
            (this->PoolingPaddingType_).valid_ = pVVar10;
          }
          pVVar10 = (this->PoolingPaddingType_).valid_;
          puVar4 = input->buffer_;
          if ((puVar4 < input->buffer_end_) && (iVar13 = (int)(char)*puVar4, -1 < (char)*puVar4)) {
            input->buffer_ = puVar4 + 1;
            bVar5 = true;
          }
          else {
            iVar13 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
            bVar5 = -1 < iVar13;
          }
          iVar14 = 6;
          if ((((bVar5) &&
               (pVar11 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                                   (input,iVar13), -1 < (long)pVar11)) &&
              (bVar5 = ValidPadding::MergePartialFromCodedStream(pVVar10,input), bVar5)) &&
             (bVar5 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                                (input,pVar11.first), bVar5)) goto LAB_00497860;
          goto LAB_00497863;
        }
      }
      else if ((uVar6 == 0x1f) && (cVar15 == -6)) {
        if (this->_oneof_case_[0] != 0x1f) {
          clear_PoolingPaddingType(this);
          this->_oneof_case_[0] = 0x1f;
          pSVar8 = (SamePadding *)operator_new(0x18);
          SamePadding::SamePadding(pSVar8);
          (this->PoolingPaddingType_).same_ = pSVar8;
        }
        pSVar8 = (this->PoolingPaddingType_).same_;
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) && (iVar13 = (int)(char)*puVar4, -1 < (char)*puVar4)) {
          input->buffer_ = puVar4 + 1;
          bVar5 = true;
        }
        else {
          iVar13 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          bVar5 = -1 < iVar13;
        }
        iVar14 = 6;
        if (bVar5) {
          pVar11 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                             (input,iVar13);
          if (-1 < (long)pVar11) {
            bVar5 = SamePadding::MergePartialFromCodedStream(pSVar8,input);
LAB_00497c04:
            iVar14 = 6;
            if (bVar5 != false) {
              bVar5 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                                (input,pVar11.first);
              if (bVar5) goto LAB_00497860;
              goto LAB_00497863;
            }
          }
LAB_00497ba2:
          iVar14 = 6;
        }
        goto LAB_00497863;
      }
LAB_00497831:
      iVar14 = 7;
      if ((uVar16 & 7) != 4 && uVar16 != 0) {
        bVar5 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar16);
        goto LAB_00497858;
      }
    }
    else {
      if (uVar6 == 0x20) {
        if (cVar15 == '\x02') {
          if (this->_oneof_case_[0] != 0x20) {
            clear_PoolingPaddingType(this);
            this->_oneof_case_[0] = 0x20;
            pPVar9 = (PoolingLayerParams_ValidCompletePadding *)operator_new(0x28);
            PoolingLayerParams_ValidCompletePadding::PoolingLayerParams_ValidCompletePadding(pPVar9)
            ;
            (this->PoolingPaddingType_).includelastpixel_ = pPVar9;
          }
          pPVar9 = (this->PoolingPaddingType_).includelastpixel_;
          puVar4 = input->buffer_;
          if ((puVar4 < input->buffer_end_) && (iVar13 = (int)(char)*puVar4, -1 < (char)*puVar4)) {
            input->buffer_ = puVar4 + 1;
            bVar5 = true;
          }
          else {
            iVar13 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
            bVar5 = -1 < iVar13;
          }
          iVar14 = 6;
          if (bVar5) {
            pVar11 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                               (input,iVar13);
            if (-1 < (long)pVar11) {
              bVar5 = PoolingLayerParams_ValidCompletePadding::MergePartialFromCodedStream
                                (pPVar9,input);
              goto LAB_00497c04;
            }
            goto LAB_00497ba2;
          }
          goto LAB_00497863;
        }
        goto LAB_00497831;
      }
      if (uVar6 == 0x32) {
        MergePartialFromCodedStream();
        if (extraout_AX == 0) goto LAB_00497831;
        iVar14 = 6;
        if (extraout_AX == 1) goto LAB_00497863;
        goto LAB_00497860;
      }
      if (uVar6 != 0x3c) goto LAB_00497831;
      MergePartialFromCodedStream();
      if ((short)extraout_EAX != 1) {
        if ((extraout_EAX & 0xffff) != 0) goto LAB_00497860;
        goto LAB_00497831;
      }
LAB_00497be9:
      iVar14 = 6;
    }
LAB_00497863:
    if (iVar14 != 0) {
      return iVar14 != 6;
    }
  } while( true );
}

Assistant:

bool PoolingLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.PoolingLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // .CoreML.Specification.PoolingLayerParams.PoolingType type = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          set_type(static_cast< ::CoreML::Specification::PoolingLayerParams_PoolingType >(value));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated uint64 kernelSize = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(82u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, this->mutable_kernelsize())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(80u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 1, 82u, input, this->mutable_kernelsize())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated uint64 stride = 20;
      case 20: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(162u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, this->mutable_stride())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(160u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 2, 162u, input, this->mutable_stride())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ValidPadding valid = 30;
      case 30: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(242u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_valid()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.SamePadding same = 31;
      case 31: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(250u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_same()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.PoolingLayerParams.ValidCompletePadding includeLastPixel = 32;
      case 32: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(258u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_includelastpixel()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool avgPoolExcludePadding = 50;
      case 50: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(400u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &avgpoolexcludepadding_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool globalPooling = 60;
      case 60: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(480u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &globalpooling_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.PoolingLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.PoolingLayerParams)
  return false;
#undef DO_
}